

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O2

LIBSSH2_CHANNEL * scp_recv(LIBSSH2_SESSION *session,char *path,libssh2_struct_stat *sb)

{
  uchar *puVar1;
  byte bVar2;
  libssh2_nonblocking_states lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  uchar *puVar8;
  LIBSSH2_CHANNEL *channel;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  longlong lVar12;
  ssize_t sVar13;
  ulong uVar14;
  char *pcVar15;
  char *e;
  
  lVar3 = session->scpRecv_state;
  switch(lVar3) {
  case libssh2_NB_state_idle:
    break;
  default:
    if (lVar3 - libssh2_NB_state_sent2 < 2) goto LAB_001178bd;
    if (lVar3 == libssh2_NB_state_sent4) goto LAB_00117b78;
    if ((lVar3 & ~libssh2_NB_state_allocated) != libssh2_NB_state_sent5) {
LAB_00117e31:
      if (sb != (libssh2_struct_stat *)0x0) {
        memset(sb,0,0x90);
        (sb->st_mtim).tv_sec = session->scpRecv_mtime;
        (sb->st_atim).tv_sec = session->scpRecv_atime;
        sb->st_size = session->scpRecv_size;
        sb->st_mode = (uint)(ushort)session->scpRecv_mode;
      }
      session->scpRecv_state = libssh2_NB_state_idle;
LAB_00117e78:
      return session->scpRecv_channel;
    }
    goto LAB_00117b8a;
  case libssh2_NB_state_created:
    goto switchD_001176a8_caseD_2;
  case libssh2_NB_state_sent:
    channel = session->scpRecv_channel;
    goto LAB_001177c0;
  case libssh2_NB_state_sent1:
    goto switchD_001176a8_caseD_4;
  }
  session->scpRecv_mtime = 0;
  session->scpRecv_atime = 0;
  session->scpRecv_mode = 0;
  session->scpRecv_size = 0;
  sVar7 = strlen(path);
  sVar9 = (0xb - (ulong)(sb == (libssh2_struct_stat *)0x0)) + sVar7 * 3;
  session->scpRecv_command_len = sVar9;
  puVar8 = (uchar *)(*session->alloc)(sVar9,&session->abstract);
  session->scpRecv_command = puVar8;
  if (puVar8 == (uchar *)0x0) {
    pcVar15 = "Unable to allocate a command buffer for SCP session";
    iVar5 = -6;
    goto LAB_00117b6e;
  }
  pcVar15 = "p";
  if (sb == (libssh2_struct_stat *)0x0) {
    pcVar15 = anon_var_dwarf_f4 + 0xc;
  }
  snprintf((char *)puVar8,session->scpRecv_command_len,"scp -%sf ",pcVar15);
  puVar8 = session->scpRecv_command;
  sVar7 = strlen((char *)puVar8);
  iVar5 = (int)sVar7;
  uVar4 = shell_quotearg(path,puVar8 + iVar5,(int)session->scpRecv_command_len - iVar5);
  session->scpRecv_command[(int)(uVar4 + iVar5)] = '\0';
  session->scpRecv_command_len = (long)(int)(uVar4 + iVar5 + 1);
  session->scpRecv_state = libssh2_NB_state_created;
switchD_001176a8_caseD_2:
  channel = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->scpRecv_channel = channel;
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar5 = libssh2_session_last_errno(session);
    if (iVar5 != -0x25) {
      (*session->free)(session->scpRecv_command,&session->abstract);
      session->scpRecv_command = (uchar *)0x0;
      goto LAB_00117d03;
    }
    pcVar15 = "Would block starting up channel";
    goto LAB_00117b68;
  }
  session->scpRecv_state = libssh2_NB_state_sent;
LAB_001177c0:
  iVar5 = _libssh2_channel_process_startup
                    (channel,"exec",4,(char *)session->scpRecv_command,session->scpRecv_command_len)
  ;
  if (iVar5 == 0) {
    (*session->free)(session->scpRecv_command,&session->abstract);
    session->scpRecv_command = (uchar *)0x0;
    session->scpRecv_response[0] = '\0';
    session->scpRecv_state = libssh2_NB_state_sent1;
switchD_001176a8_caseD_4:
    sVar13 = _libssh2_channel_write(session->scpRecv_channel,0,session->scpRecv_response,1);
    if ((int)sVar13 == 1) {
      session->scpRecv_response_len = 0;
      session->scpRecv_state = libssh2_NB_state_sent2;
LAB_001178bd:
      if (sb == (libssh2_struct_stat *)0x0) {
LAB_00117b78:
        session->scpRecv_response_len = 0;
        session->scpRecv_state = libssh2_NB_state_sent5;
LAB_00117b8a:
        puVar8 = session->scpRecv_response;
        uVar14 = session->scpRecv_response_len;
        pcVar15 = "Would block waiting for SCP response";
        do {
          do {
            do {
              while( true ) {
                if (0xff < uVar14) goto LAB_00117e31;
                e = (char *)0x0;
                if (session->scpRecv_state == libssh2_NB_state_sent5) break;
                if (session->scpRecv_state == libssh2_NB_state_sent6) goto LAB_00117e0f;
              }
              sVar13 = _libssh2_channel_read(session->scpRecv_channel,0,(char *)(puVar8 + uVar14),1)
              ;
              iVar5 = (int)sVar13;
              if (iVar5 == -0x25) goto LAB_00117e8b;
              if (iVar5 < 0) goto LAB_00117c93;
              if (iVar5 == 0) goto LAB_00117ca1;
              sVar9 = session->scpRecv_response_len;
              uVar14 = sVar9 + 1;
              session->scpRecv_response_len = uVar14;
              if (session->scpRecv_response[0] != 'C') {
                pcVar15 = "Invalid response from SCP server";
                goto LAB_00117cc5;
              }
            } while (uVar14 < 2);
            bVar2 = puVar8[sVar9];
            if (((bVar2 != 10) && (bVar2 != 0xd)) && (bVar2 < 0x20)) goto LAB_00117d1b;
          } while (uVar14 < 7);
          if (bVar2 == 10) goto LAB_00117c62;
        } while (uVar14 != 0x100);
      }
      else {
        puVar8 = session->scpRecv_response;
        uVar14 = session->scpRecv_response_len;
        do {
          do {
            do {
              do {
                if (0xff < uVar14) goto LAB_00117b78;
                if (session->scpRecv_state == libssh2_NB_state_sent3) goto LAB_00117b3f;
              } while (session->scpRecv_state != libssh2_NB_state_sent2);
              sVar13 = _libssh2_channel_read(session->scpRecv_channel,0,(char *)(puVar8 + uVar14),1)
              ;
              iVar5 = (int)sVar13;
              if (iVar5 == -0x25) {
                pcVar15 = "Would block waiting for SCP response";
                goto LAB_00117b68;
              }
              if (iVar5 < 0) goto LAB_00117c93;
              if (iVar5 == 0) goto LAB_00117ca1;
              sVar9 = session->scpRecv_response_len;
              uVar14 = sVar9 + 1;
              session->scpRecv_response_len = uVar14;
              if (session->scpRecv_response[0] != 'T') {
                sVar9 = _libssh2_channel_packet_data_len(session->scpRecv_channel,0);
                pcVar15 = (char *)(*session->alloc)(sVar9 + 1,&session->abstract);
                if (pcVar15 != (char *)0x0) {
                  _libssh2_channel_read(session->scpRecv_channel,0,pcVar15,sVar9);
                  pcVar15[sVar9] = '\0';
                  _libssh2_error(session,-0x1c,"Failed to recv file");
                  (*session->free)(pcVar15,&session->abstract);
                  goto LAB_00117cd0;
                }
                pcVar15 = "Failed to get memory ";
                iVar5 = -6;
                goto LAB_00117ccb;
              }
            } while (uVar14 < 2);
            bVar2 = puVar8[sVar9];
            if (((byte)(bVar2 - 0x3a) < 0xf6) &&
               ((0x20 < bVar2 || ((0x100002400U >> ((ulong)(uint)bVar2 & 0x3f) & 1) == 0))))
            goto LAB_00117d1b;
          } while (uVar14 < 9);
          if (bVar2 == 10) goto LAB_001179c9;
        } while (uVar14 != 0x100);
      }
      pcVar15 = "Unterminated response from SCP server";
      goto LAB_00117cc5;
    }
    if ((int)sVar13 != -0x25) goto LAB_00117cd0;
    pcVar15 = "Would block sending initial wakeup";
    goto LAB_00117b68;
  }
  if (iVar5 == -0x25) {
    pcVar15 = "Would block requesting SCP startup";
    goto LAB_00117b68;
  }
  (*session->free)(session->scpRecv_command,&session->abstract);
  session->scpRecv_command = (uchar *)0x0;
  goto LAB_00117cd0;
LAB_00117c93:
  pcVar15 = "Failed reading SCP response";
  goto LAB_00117ccb;
LAB_00117ca1:
  iVar5 = libssh2_channel_eof(session->scpRecv_channel);
  if (iVar5 == 0) goto LAB_00117e78;
  pcVar15 = "Unexpected channel close";
  goto LAB_00117cc5;
LAB_00117d1b:
  pcVar15 = "Invalid data in SCP response";
  goto LAB_00117cc5;
LAB_001179c9:
  for (; (session->scpRecv_response[sVar9] == '\r' || (session->scpRecv_response[sVar9] == '\n'));
      sVar9 = sVar9 - 1) {
    session->scpRecv_response_len = sVar9;
  }
  session->scpRecv_response[sVar9 + 1] = '\0';
  if (session->scpRecv_response_len < 8) goto LAB_00117c8a;
  puVar1 = session->scpRecv_response + 1;
  pcVar15 = strchr((char *)puVar1,0x20);
  if (pcVar15 == (char *)0x0 || ((uchar *)pcVar15 == puVar1 || (long)pcVar15 - (long)puVar1 < 0)) {
    pcVar15 = "Invalid response from SCP server, malformed mtime";
    goto LAB_00117cc5;
  }
  pcVar11 = pcVar15 + 1;
  *pcVar15 = '\0';
  lVar10 = strtol((char *)puVar1,(char **)0x0,10);
  session->scpRecv_mtime = lVar10;
  pcVar15 = strchr(pcVar11,0x20);
  if (pcVar15 == (char *)0x0 || (pcVar15 == pcVar11 || (long)pcVar15 - (long)pcVar11 < 0)) {
    pcVar15 = "Invalid response from SCP server, malformed mtime.usec";
    goto LAB_00117cc5;
  }
  pcVar15 = pcVar15 + 1;
  pcVar11 = strchr(pcVar15,0x20);
  if (pcVar11 == (char *)0x0 || (pcVar11 == pcVar15 || (long)pcVar11 - (long)pcVar15 < 0))
  goto LAB_00117dbb;
  *pcVar11 = '\0';
  lVar10 = strtol(pcVar15,(char **)0x0,10);
  session->scpRecv_atime = lVar10;
  session->scpRecv_response[0] = '\0';
  session->scpRecv_state = libssh2_NB_state_sent3;
LAB_00117b3f:
  sVar13 = _libssh2_channel_write(session->scpRecv_channel,0,puVar8,1);
  if ((int)sVar13 == 1) goto LAB_00117b78;
  if ((int)sVar13 != -0x25) goto LAB_00117cd0;
  pcVar15 = "Would block waiting to send SCP ACK";
LAB_00117b68:
  iVar5 = -0x25;
LAB_00117b6e:
  _libssh2_error(session,iVar5,pcVar15);
  return (LIBSSH2_CHANNEL *)0x0;
LAB_00117c62:
  for (; (session->scpRecv_response[sVar9] == '\r' || (session->scpRecv_response[sVar9] == '\n'));
      sVar9 = sVar9 - 1) {
    session->scpRecv_response_len = sVar9;
  }
  session->scpRecv_response[sVar9 + 1] = '\0';
  if (session->scpRecv_response_len < 6) {
LAB_00117c8a:
    pcVar15 = "Invalid response from SCP server, too short";
  }
  else {
    puVar1 = session->scpRecv_response + 1;
    pcVar15 = strchr((char *)puVar1,0x20);
    if (pcVar15 == (char *)0x0 || ((uchar *)pcVar15 == puVar1 || (long)pcVar15 - (long)puVar1 < 0))
    {
      pcVar15 = "Invalid response from SCP server, malformed mode";
    }
    else {
      *pcVar15 = '\0';
      lVar10 = strtol((char *)puVar1,&e,8);
      session->scpRecv_mode = lVar10;
      if ((e == (char *)0x0) || (*e == '\0')) {
        pcVar15 = pcVar15 + 1;
        pcVar11 = strchr(pcVar15,0x20);
        if ((pcVar11 == pcVar15 || (long)pcVar11 - (long)pcVar15 < 0) || pcVar11 == (char *)0x0) {
LAB_00117dbb:
          pcVar15 = "Invalid response from SCP server, too short or malformed";
        }
        else {
          *pcVar11 = '\0';
          lVar12 = strtoll(pcVar15,&e,10);
          session->scpRecv_size = lVar12;
          if ((e == (char *)0x0) || (*e == '\0')) {
            session->scpRecv_response[0] = '\0';
            session->scpRecv_state = libssh2_NB_state_sent6;
LAB_00117e0f:
            sVar13 = _libssh2_channel_write(session->scpRecv_channel,0,puVar8,1);
            if ((int)sVar13 == -0x25) {
              pcVar15 = "Would block sending SCP ACK";
LAB_00117e8b:
              iVar5 = -0x25;
              goto LAB_00117b6e;
            }
            if ((int)sVar13 != 1) goto LAB_00117cd0;
            goto LAB_00117e31;
          }
          pcVar15 = "Invalid response from SCP server, invalid size";
        }
      }
      else {
        pcVar15 = "Invalid response from SCP server, invalid mode";
      }
    }
  }
LAB_00117cc5:
  iVar5 = -0x1c;
LAB_00117ccb:
  _libssh2_error(session,iVar5,pcVar15);
LAB_00117cd0:
  iVar5 = session->err_code;
  pcVar15 = session->err_msg;
  do {
    iVar6 = libssh2_channel_free(session->scpRecv_channel);
  } while (iVar6 == -0x25);
  session->err_code = iVar5;
  session->err_msg = pcVar15;
  session->scpRecv_channel = (LIBSSH2_CHANNEL *)0x0;
LAB_00117d03:
  session->scpRecv_state = libssh2_NB_state_idle;
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

static LIBSSH2_CHANNEL *
scp_recv(LIBSSH2_SESSION * session, const char *path, libssh2_struct_stat * sb)
{
    int cmd_len;
    int rc;
    int tmp_err_code;
    const char *tmp_err_msg;

    if (session->scpRecv_state == libssh2_NB_state_idle) {
        session->scpRecv_mode = 0;
        session->scpRecv_size = 0;
        session->scpRecv_mtime = 0;
        session->scpRecv_atime = 0;

        session->scpRecv_command_len =
            _libssh2_shell_quotedsize(path) + sizeof("scp -f ") + (sb?1:0);

        session->scpRecv_command =
            LIBSSH2_ALLOC(session, session->scpRecv_command_len);

        if (!session->scpRecv_command) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a command buffer for "
                           "SCP session");
            return NULL;
        }

        snprintf((char *)session->scpRecv_command,
                 session->scpRecv_command_len,
                 "scp -%sf ", sb?"p":"");

        cmd_len = strlen((char *)session->scpRecv_command);
        cmd_len += shell_quotearg(path,
                                  &session->scpRecv_command[cmd_len],
                                  session->scpRecv_command_len - cmd_len);

        session->scpRecv_command[cmd_len] = '\0';
        session->scpRecv_command_len = cmd_len + 1;

        _libssh2_debug(session, LIBSSH2_TRACE_SCP,
                       "Opening channel for SCP receive");

        session->scpRecv_state = libssh2_NB_state_created;
    }

    if (session->scpRecv_state == libssh2_NB_state_created) {
        /* Allocate a channel */
        session->scpRecv_channel =
            _libssh2_channel_open(session, "session",
                                  sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL,
                                  0);
        if (!session->scpRecv_channel) {
            if (libssh2_session_last_errno(session) !=
                LIBSSH2_ERROR_EAGAIN) {
                LIBSSH2_FREE(session, session->scpRecv_command);
                session->scpRecv_command = NULL;
                session->scpRecv_state = libssh2_NB_state_idle;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            return NULL;
        }

        session->scpRecv_state = libssh2_NB_state_sent;
    }

    if (session->scpRecv_state == libssh2_NB_state_sent) {
        /* Request SCP for the desired file */
        rc = _libssh2_channel_process_startup(session->scpRecv_channel, "exec",
                                              sizeof("exec") - 1,
                                              (char *) session->scpRecv_command,
                                              session->scpRecv_command_len);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting SCP startup");
            return NULL;
        } else if (rc) {
            LIBSSH2_FREE(session, session->scpRecv_command);
            session->scpRecv_command = NULL;
            goto scp_recv_error;
        }
        LIBSSH2_FREE(session, session->scpRecv_command);
        session->scpRecv_command = NULL;

        _libssh2_debug(session, LIBSSH2_TRACE_SCP, "Sending initial wakeup");
        /* SCP ACK */
        session->scpRecv_response[0] = '\0';

        session->scpRecv_state = libssh2_NB_state_sent1;
    }

    if (session->scpRecv_state == libssh2_NB_state_sent1) {
        rc = _libssh2_channel_write(session->scpRecv_channel, 0,
                                    session->scpRecv_response, 1);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending initial wakeup");
            return NULL;
        } else if (rc != 1) {
            goto scp_recv_error;
        }

        /* Parse SCP response */
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent2;
    }

    if ((session->scpRecv_state == libssh2_NB_state_sent2)
        || (session->scpRecv_state == libssh2_NB_state_sent3)) {
        while (sb && (session->scpRecv_response_len <
                      LIBSSH2_SCP_RESPONSE_BUFLEN)) {
            unsigned char *s, *p;

            if (session->scpRecv_state == libssh2_NB_state_sent2) {
                rc = _libssh2_channel_read(session->scpRecv_channel, 0,
                                           (char *) session->
                                           scpRecv_response +
                                           session->scpRecv_response_len, 1);
                if (rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if (rc < 0) {
                    /* error, give up */
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if (session->scpRecv_response[0] != 'T') {
                    size_t err_len;
                    char *err_msg;

                    /* there can be
                       01 for warnings
                       02 for errors

                       The following string MUST be newline terminated
                    */
                    err_len =
                        _libssh2_channel_packet_data_len(session->
                                                         scpRecv_channel, 0);
                    err_msg = LIBSSH2_ALLOC(session, err_len + 1);
                    if (!err_msg) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Failed to get memory ");
                        goto scp_recv_error;
                    }

                    /* Read the remote error message */
                    (void)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                err_msg, err_len);
                    /* If it failed for any reason, we ignore it anyway. */

                    /* zero terminate the error */
                    err_msg[err_len]=0;

                    _libssh2_debug(session, LIBSSH2_TRACE_SCP,
                                   "got %02x %s", session->scpRecv_response[0],
                                   err_msg);

                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Failed to recv file");

                    LIBSSH2_FREE(session, err_msg);
                    goto scp_recv_error;
                }

                if ((session->scpRecv_response_len > 1) &&
                    ((session->
                      scpRecv_response[session->scpRecv_response_len - 1] <
                      '0')
                     || (session->
                         scpRecv_response[session->scpRecv_response_len - 1] >
                         '9'))
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        ' ')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if ((session->scpRecv_response_len < 9)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if (session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response from SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while ((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n'))
                    session->scpRecv_response_len--;
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if (session->scpRecv_response_len < 8) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short" );
                    goto scp_recv_error;
                }

                s = session->scpRecv_response + 1;

                p = (unsigned char *) strchr((char *) s, ' ');
                if (!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mtime");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_mtime = strtol((char *) s, NULL, 10);

                s = (unsigned char *) strchr((char *) p, ' ');
                if (!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, malformed mtime.usec");
                    goto scp_recv_error;
                }

                /* Ignore mtime.usec */
                s++;
                p = (unsigned char *) strchr((char *) s, ' ');
                if (!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, too short or malformed");
                    goto scp_recv_error;
                }

                *p = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_atime = strtol((char *) s, NULL, 10);

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent3;
            }

            if (session->scpRecv_state == libssh2_NB_state_sent3) {
                rc = _libssh2_channel_write(session->scpRecv_channel, 0,
                                            session->scpRecv_response, 1);
                if (rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting to send SCP ACK");
                    return NULL;
                } else if (rc != 1) {
                    goto scp_recv_error;
                }

                _libssh2_debug(session, LIBSSH2_TRACE_SCP,
                               "mtime = %ld, atime = %ld",
                               session->scpRecv_mtime, session->scpRecv_atime);

                /* We *should* check that atime.usec is valid, but why let
                   that stop use? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent4;
    }

    if (session->scpRecv_state == libssh2_NB_state_sent4) {
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent5;
    }

    if ((session->scpRecv_state == libssh2_NB_state_sent5)
        || (session->scpRecv_state == libssh2_NB_state_sent6)) {
        while (session->scpRecv_response_len < LIBSSH2_SCP_RESPONSE_BUFLEN) {
            char *s, *p, *e = NULL;

            if (session->scpRecv_state == libssh2_NB_state_sent5) {
                rc = _libssh2_channel_read(session->scpRecv_channel, 0,
                                           (char *) session->
                                           scpRecv_response +
                                           session->scpRecv_response_len, 1);
                if (rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if (rc < 0) {
                    /* error, bail out*/
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if (session->scpRecv_response[0] != 'C') {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server");
                    goto scp_recv_error;
                }

                if ((session->scpRecv_response_len > 1) &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1] !=
                     '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')
                    &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1]
                     < 32)) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if ((session->scpRecv_response_len < 7)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if (session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response from SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while ((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n')) {
                    session->scpRecv_response_len--;
                }
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if (session->scpRecv_response_len < 6) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, too short");
                    goto scp_recv_error;
                }

                s = (char *) session->scpRecv_response + 1;

                p = strchr(s, ' ');
                if (!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, malformed mode");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */

                session->scpRecv_mode = strtol(s, &e, 8);
                if (e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, invalid mode");
                    goto scp_recv_error;
                }

                s = strchr(p, ' ');
                if (!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, too short or malformed");
                    goto scp_recv_error;
                }

                *s = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_size = scpsize_strtol(p, &e, 10);
                if (e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, invalid size");
                    goto scp_recv_error;
                }

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent6;
            }

            if (session->scpRecv_state == libssh2_NB_state_sent6) {
                rc = _libssh2_channel_write(session->scpRecv_channel, 0,
                                            session->scpRecv_response, 1);
                if (rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block sending SCP ACK");
                    return NULL;
                } else if (rc != 1) {
                    goto scp_recv_error;
                }
                _libssh2_debug(session, LIBSSH2_TRACE_SCP,
                               "mode = 0%lo size = %ld", session->scpRecv_mode,
                               session->scpRecv_size);

                /* We *should* check that basename is valid, but why let that
                   stop us? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent7;
    }

    if (sb) {
        memset(sb, 0, sizeof(libssh2_struct_stat));

        sb->st_mtime = session->scpRecv_mtime;
        sb->st_atime = session->scpRecv_atime;
        sb->st_size = session->scpRecv_size;
        sb->st_mode = (unsigned short)session->scpRecv_mode;
    }

    session->scpRecv_state = libssh2_NB_state_idle;
    return session->scpRecv_channel;

  scp_recv_empty_channel:
    /* the code only jumps here as a result of a zero read from channel_read()
       so we check EOF status to avoid getting stuck in a loop */
    if(libssh2_channel_eof(session->scpRecv_channel))
        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                       "Unexpected channel close");
    else
        return session->scpRecv_channel;
    /* fall-through */
  scp_recv_error:
    tmp_err_code = session->err_code;
    tmp_err_msg = session->err_msg;
    while (libssh2_channel_free(session->scpRecv_channel) ==
           LIBSSH2_ERROR_EAGAIN);
    session->err_code = tmp_err_code;
    session->err_msg = tmp_err_msg;
    session->scpRecv_channel = NULL;
    session->scpRecv_state = libssh2_NB_state_idle;
    return NULL;
}